

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::decomposeStructBufferMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  byte bVar1;
  const_iterator __first;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_02;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TVariable *variable;
  TIntermSymbol *left;
  TIntermAggregate *pTVar9;
  TIntermSymbol *index;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermAggregate *right;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TIntermConstantUnion *pTVar10;
  undefined4 extraout_var_11;
  TIntermTyped *pTVar11;
  TIntermTyped *right_00;
  undefined4 extraout_var_12;
  TIntermBinary *pTVar12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  _func_int **pp_Var13;
  long lVar14;
  long lVar15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TIntermediate *pTVar16;
  long lStack_1e0;
  TIntermTyped *local_1d0;
  TIntermTyped *local_180;
  anon_class_24_3_252b1faa incDecCounter;
  TType derefType;
  TType indexType;
  long *plVar6;
  undefined4 extraout_var_15;
  
  if (*node == (TIntermTyped *)0x0) {
    return;
  }
  iVar3 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  if (arguments == (TIntermNode *)0x0) {
    return;
  }
  if (CONCAT44(extraout_var,iVar3) == 0) {
    return;
  }
  iVar3 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 0xb8);
  iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
  plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
  local_180 = (TIntermTyped *)0x0;
  if (plVar6 == (long *)0x0) {
    lStack_1e0 = 0x60;
  }
  else {
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    if (*(long *)(lVar7 + 8) == *(long *)(lVar7 + 0x10)) {
      return;
    }
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    if (**(long **)(lVar7 + 8) == 0) {
      return;
    }
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    arguments = (TIntermNode *)**(undefined8 **)(lVar7 + 8);
    lStack_1e0 = 0x18;
  }
  pTVar8 = (TIntermTyped *)(**(code **)((long)arguments->_vptr_TIntermNode + lStack_1e0))(arguments)
  ;
  if (pTVar8 == (TIntermTyped *)0x0) {
    return;
  }
  local_180 = pTVar8;
  iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar8);
  if (CONCAT44(extraout_var_02,iVar4) == 0) {
    return;
  }
  incDecCounter.bufferObj = &local_180;
  incDecCounter.this = this;
  incDecCounter.loc = loc;
  pTVar8 = indexStructBufferContent(this,loc,pTVar8);
  if (pTVar8 == (TIntermTyped *)0x0) {
    return;
  }
  switch(iVar3) {
  case 0x2a1:
  case 0x2a2:
  case 0x2a3:
  case 0x2a4:
  case 0x2a5:
  case 0x2a6:
  case 0x2a7:
  case 0x2a8:
  case 0x2a9:
    this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (**(code **)(*plVar6 + 400))(plVar6);
    iVar3 = (*(this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start[1]->_vptr_TIntermNode[3])();
    pTVar11 = makeIntegerIndex(this,(TIntermTyped *)CONCAT44(extraout_var_03,iVar3));
    pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar10 = TIntermediate::addConstantUnion(pTVar16,2,loc,true);
    TType::TType(&derefType,EbtInt,EvqTemporary,1,0,0,false);
    pTVar12 = TIntermediate::addBinaryNode
                        (pTVar16,EOpRightShift,pTVar11,&pTVar10->super_TIntermTyped,loc,&derefType);
    iVar3 = (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])(pTVar12);
    pTVar11 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         ((*(uint *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) != 2) +
                         EOpIndexDirect,pTVar8,(TIntermTyped *)pTVar12,loc);
    iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
    TType::TType(&derefType,(TType *)CONCAT44(extraout_var_05,iVar3),0,false);
    (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar11,&derefType);
    (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>)._M_impl.
    super__Vector_impl_data._M_start[1] = &pTVar11->super_TIntermNode;
    __first._M_current =
         (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
         _M_impl.super__Vector_impl_data._M_start;
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::erase
              (this_00,__first,(const_iterator)(__first._M_current + 1));
    break;
  case 700:
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    pTVar11 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
    pTVar12 = (TIntermBinary *)makeIntegerIndex(this,pTVar11);
    iVar3 = (*(local_180->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_13,iVar3));
    if ((*(ushort *)(lVar7 + 10) & 0x1ff) - 0x99 < 2) {
      pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar10 = TIntermediate::addConstantUnion(pTVar16,2,loc,true);
      TType::TType(&derefType,EbtInt,EvqTemporary,1,0,0,false);
      pTVar12 = TIntermediate::addBinaryNode
                          (pTVar16,EOpRightShift,(TIntermTyped *)pTVar12,
                           &pTVar10->super_TIntermTyped,loc,&derefType);
    }
    iVar3 = (*(pTVar12->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])(pTVar12);
    pTVar11 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         ((*(uint *)(CONCAT44(extraout_var_14,iVar3) + 8) & 0x7f) != 2) +
                         EOpIndexDirect,pTVar8,(TIntermTyped *)pTVar12,loc);
    *node = pTVar11;
    pp_Var13 = (pTVar8->super_TIntermNode)._vptr_TIntermNode;
    goto LAB_0039040d;
  case 0x2bd:
    lVar14 = (**(code **)(*plVar6 + 400))(plVar6);
    lVar7 = *(long *)(lVar14 + 0x10);
    lVar14 = *(long *)(lVar14 + 8);
    lVar15 = (**(code **)(*plVar6 + 400))(plVar6);
    pTVar11 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar15 + 8) + 8) + 0x18))();
    if ((int)((ulong)(lVar7 - lVar14) >> 3) < 3) {
      local_1d0 = (TIntermTyped *)0x0;
    }
    else {
      lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
      local_1d0 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 0x10) + 0x18))();
    }
    iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar3) + 0xf0))
                      ((long *)CONCAT44(extraout_var_17,iVar3));
    if (cVar2 == '\0') {
      pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
      pTVar10 = (TIntermConstantUnion *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar16,loc,EOpArrayLength,true,&pTVar8->super_TIntermNode,
                           (TType *)CONCAT44(extraout_var_19,iVar3));
      pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    }
    else {
      iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar3) + 0x78))
                        ((long *)CONCAT44(extraout_var_18,iVar3));
      pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar10 = TIntermediate::addConstantUnion(pTVar16,iVar3,loc,true);
    }
    pTVar11 = TIntermediate::addAssign(pTVar16,EOpAssign,pTVar11,&pTVar10->super_TIntermTyped,loc);
    pTVar9 = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)0x0,&pTVar11->super_TIntermNode,loc);
    if (local_1d0 != (TIntermTyped *)0x0) {
      iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar4) + 0x58))
                        ((long *)CONCAT44(extraout_var_21,iVar4));
      bVar1 = *(byte *)(lVar7 + 0x10);
      iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar4) + 0x58))
                        ((long *)CONCAT44(extraout_var_22,iVar4));
      TIntermediate::getMemberAlignment
                ((TType *)CONCAT44(extraout_var_20,iVar3),(int *)&derefType,(int *)&indexType,
                 bVar1 & 0xf,(uint)((ulong)*(undefined8 *)(lVar7 + 8) >> 0x3d) == 1);
      pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar10 = TIntermediate::addConstantUnion(pTVar16,(int)indexType._vptr_TType,loc,true);
      pTVar8 = TIntermediate::addAssign
                         (pTVar16,EOpAssign,local_1d0,&pTVar10->super_TIntermTyped,loc);
      pTVar9 = TIntermediate::growAggregate
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (TIntermNode *)pTVar9,&pTVar8->super_TIntermNode);
    }
    (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (pTVar9,1);
    *node = (TIntermTyped *)pTVar9;
    break;
  case 0x2c2:
  case 0x2c3:
  case 0x2c4:
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    pTVar11 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
    pTVar11 = makeIntegerIndex(this,pTVar11);
    pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar10 = TIntermediate::addConstantUnion(pTVar16,2,loc,true);
    TType::TType(&derefType,EbtInt,EvqTemporary,1,0,0,false);
    pTVar12 = TIntermediate::addBinaryNode
                        (pTVar16,EOpRightShift,pTVar11,&pTVar10->super_TIntermTyped,loc,&derefType);
    TType::TType(&derefType,EbtInt,EvqTemporary,1,0,0,false);
    variable = makeInternalVariable(this,"byteAddrTemp",&derefType);
    left = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
    pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar11 = TIntermediate::addAssign
                        (pTVar16,EOpAssign,&left->super_TIntermTyped,(TIntermTyped *)pTVar12,loc);
    pTVar9 = TIntermediate::growAggregate(pTVar16,(TIntermNode *)0x0,&pTVar11->super_TIntermNode);
    right = (TIntermAggregate *)0x0;
    for (iVar4 = 0; iVar3 + -0x2c0 != iVar4; iVar4 = iVar4 + 1) {
      index = left;
      if (iVar4 != 0) {
        pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar10 = TIntermediate::addConstantUnion(pTVar16,iVar4,loc,true);
        TType::TType(&derefType,EbtInt,EvqTemporary,1,0,0,false);
        index = (TIntermSymbol *)
                TIntermediate::addBinaryNode
                          (pTVar16,EOpAdd,&left->super_TIntermTyped,&pTVar10->super_TIntermTyped,loc
                           ,&derefType);
      }
      iVar5 = (*(index->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(index);
      pTVar11 = TIntermediate::addIndex
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           ((*(uint *)(CONCAT44(extraout_var_06,iVar5) + 8) & 0x7f) != 2) +
                           EOpIndexDirect,pTVar8,&index->super_TIntermTyped,loc);
      iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      TType::TType(&derefType,(TType *)CONCAT44(extraout_var_07,iVar5),0,false);
      TQualifier::makeTemporary(&derefType.qualifier);
      (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar11,&derefType);
      right = TIntermediate::growAggregate
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         (TIntermNode *)right,&pTVar11->super_TIntermNode);
    }
    t = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar8);
    TType::TType(&derefType,t,EvqTemporary,iVar3 + -0x2c0,0,0,false);
    (*(right->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (right,&derefType);
    iVar4 = (*(right->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [6])(right);
    (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x188))
              ((long *)CONCAT44(extraout_var_08,iVar4),iVar3 + -0x147);
    pTVar9 = TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        (TIntermNode *)pTVar9,(TIntermNode *)right);
    iVar3 = (*(right->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(right);
    (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar9,CONCAT44(extraout_var_09,iVar3));
    iVar3 = (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [6])(pTVar9);
    (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x188))
              ((long *)CONCAT44(extraout_var_10,iVar3),1);
    *node = (TIntermTyped *)pTVar9;
    break;
  case 0x2c5:
  case 0x2c6:
  case 0x2c7:
  case 0x2c8:
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    pTVar8 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
    makeIntegerIndex(this,pTVar8);
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    (**(code **)(**(long **)(*(long *)(lVar7 + 8) + 0x10) + 0x18))();
    (*(code *)(&DAT_0073000c + *(int *)(&DAT_0073000c + (ulong)(iVar3 - 0x2c5) * 4)))();
    return;
  case 0x2c9:
    pTVar12 = (TIntermBinary *)
              decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&incDecCounter,1);
    goto LAB_003904ee;
  case 0x2ca:
    pTVar8 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&incDecCounter,-1);
    pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar10 = TIntermediate::addConstantUnion(pTVar16,-1,loc,true);
    iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
    pTVar12 = TIntermediate::addBinaryNode
                        (pTVar16,EOpAdd,pTVar8,&pTVar10->super_TIntermTyped,loc,
                         (TType *)CONCAT44(extraout_var_16,iVar3));
    goto LAB_003904ee;
  case 0x2cb:
    pTVar11 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&incDecCounter,-1);
    pTVar16 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar10 = TIntermediate::addConstantUnion(pTVar16,-1,loc,true);
    iVar3 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
    pTVar12 = TIntermediate::addBinaryNode
                        (pTVar16,EOpAdd,pTVar11,&pTVar10->super_TIntermTyped,loc,
                         (TType *)CONCAT44(extraout_var_11,iVar3));
    pTVar11 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexIndirect,pTVar8,(TIntermTyped *)pTVar12,loc);
    *node = pTVar11;
    pp_Var13 = (pTVar8->super_TIntermNode)._vptr_TIntermNode;
LAB_0039040d:
    iVar3 = (*pp_Var13[0x1e])(pTVar8);
    TType::TType(&derefType,(TType *)CONCAT44(extraout_var_15,iVar3),0,false);
    (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x1d])(*node,&derefType);
    break;
  case 0x2d5:
    pTVar11 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()(&incDecCounter,1);
    pTVar11 = TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexIndirect,pTVar8,pTVar11,loc);
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    right_00 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + 8) + 0x18))();
    iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
    TType::TType(&derefType,(TType *)CONCAT44(extraout_var_12,iVar3),0,false);
    (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar11,&derefType);
    pTVar12 = (TIntermBinary *)
              TIntermediate::addAssign
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpAssign
                         ,pTVar11,right_00,loc);
LAB_003904ee:
    *node = (TIntermTyped *)pTVar12;
  }
  return;
}

Assistant:

void HlslParseContext::decomposeStructBufferMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || node->getAsOperator() == nullptr || arguments == nullptr)
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    TIntermAggregate* argAggregate = arguments->getAsAggregate();

    // Buffer is the object upon which method is called, so always arg 0
    TIntermTyped* bufferObj = nullptr;

    // The parameters can be an aggregate, or just a the object as a symbol if there are no fn params.
    if (argAggregate) {
        if (argAggregate->getSequence().empty())
            return;
        if (argAggregate->getSequence()[0])
            bufferObj = argAggregate->getSequence()[0]->getAsTyped();
    } else {
        bufferObj = arguments->getAsSymbolNode();
    }

    if (bufferObj == nullptr || bufferObj->getAsSymbolNode() == nullptr)
        return;

    // Some methods require a hidden internal counter, obtained via getStructBufferCounter().
    // This lambda adds something to it and returns the old value.
    const auto incDecCounter = [&](int incval) -> TIntermTyped* {
        TIntermTyped* incrementValue = intermediate.addConstantUnion(static_cast<unsigned int>(incval), loc, true);
        TIntermTyped* counter = getStructBufferCounter(loc, bufferObj); // obtain the counter member

        if (counter == nullptr)
            return nullptr;

        TIntermAggregate* counterIncrement = new TIntermAggregate(EOpAtomicAdd);
        counterIncrement->setType(TType(EbtUint, EvqTemporary));
        counterIncrement->setLoc(loc);
        counterIncrement->getSequence().push_back(counter);
        counterIncrement->getSequence().push_back(incrementValue);

        return counterIncrement;
    };

    // Index to obtain the runtime sized array out of the buffer.
    TIntermTyped* argArray = indexStructBufferContent(loc, bufferObj);
    if (argArray == nullptr)
        return;  // It might not be a struct buffer method.

    switch (op) {
    case EOpMethodLoad:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            const TType& bufferType = bufferObj->getType();

            const TBuiltInVariable builtInType = bufferType.getQualifier().declaredBuiltIn;

            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself.
            const bool isByteAddressBuffer = (builtInType == EbvByteAddressBuffer   ||
                                              builtInType == EbvRWByteAddressBuffer);


            if (isByteAddressBuffer)
                argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                      intermediate.addConstantUnion(2, loc, true),
                                                      loc, TType(EbtInt));

            // Index into the array to find the item being loaded.
            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;

            node = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);
        }

        break;

    case EOpMethodLoad2:
    case EOpMethodLoad3:
    case EOpMethodLoad4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            TOperator constructOp = EOpNull;
            int size = 0;

            switch (op) {
            case EOpMethodLoad2: size = 2; constructOp = EOpConstructVec2; break;
            case EOpMethodLoad3: size = 3; constructOp = EOpConstructVec3; break;
            case EOpMethodLoad4: size = 4; constructOp = EOpConstructVec4; break;
            default: assert(0);
            }

            TIntermTyped* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true),
                                                                   loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            TIntermTyped* vec = nullptr;

            // These are only valid on (rw)byteaddressbuffers, so we can always perform the >>2
            // address conversion.
            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx,
                                                           intermediate.addConstantUnion(idx, loc, true),
                                                           loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* indexVal = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);

                TType derefType(argArray->getType(), 0);
                derefType.getQualifier().makeTemporary();
                indexVal->setType(derefType);

                vec = intermediate.growAggregate(vec, indexVal);
            }

            vec->setType(TType(argArray->getBasicType(), EvqTemporary, size));
            vec->getAsAggregate()->setOperator(constructOp);

            body = intermediate.growAggregate(body, vec);
            body->setType(vec->getType());
            body->getAsAggregate()->setOperator(EOpSequence);

            node = body;
        }

        break;

    case EOpMethodStore:
    case EOpMethodStore2:
    case EOpMethodStore3:
    case EOpMethodStore4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index
            TIntermTyped* argValue = argAggregate->getSequence()[2]->getAsTyped();  // value

            // Index into the array to find the item being loaded.
            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself).

            int size = 0;

            switch (op) {
            case EOpMethodStore:  size = 1; break;
            case EOpMethodStore2: size = 2; break;
            case EOpMethodStore3: size = 3; break;
            case EOpMethodStore4: size = 4; break;
            default: assert(0);
            }

            TIntermAggregate* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true), loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;
                TIntermTyped* idxConst = intermediate.addConstantUnion(idx, loc, true);

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx, idxConst, loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* lValue = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);
                const TType derefType(argArray->getType(), 0);
                lValue->setType(derefType);

                TIntermTyped* rValue;
                if (size == 1) {
                    rValue = argValue;
                } else {
                    rValue = intermediate.addIndex(EOpIndexDirect, argValue, idxConst, loc);
                    const TType indexType(argValue->getType(), 0);
                    rValue->setType(indexType);
                }

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpMethodGetDimensions:
        {
            const int numArgs = (int)argAggregate->getSequence().size();
            TIntermTyped* argNumItems = argAggregate->getSequence()[1]->getAsTyped();  // out num items
            TIntermTyped* argStride   = numArgs > 2 ? argAggregate->getSequence()[2]->getAsTyped() : nullptr;  // out stride

            TIntermAggregate* body = nullptr;

            // Length output:
            if (argArray->getType().isSizedArray()) {
                const int length = argArray->getType().getOuterArraySize();
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems,
                                                              intermediate.addConstantUnion(length, loc, true), loc);
                body = intermediate.growAggregate(body, assign, loc);
            } else {
                TIntermTyped* lengthCall = intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, argArray,
                                                                               argNumItems->getType());
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems, lengthCall, loc);
                body = intermediate.growAggregate(body, assign, loc);
            }

            // Stride output:
            if (argStride != nullptr) {
                int size;
                int stride;
                intermediate.getMemberAlignment(argArray->getType(), size, stride, argArray->getType().getQualifier().layoutPacking,
                                                argArray->getType().getQualifier().layoutMatrix == ElmRowMajor);

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argStride,
                                                              intermediate.addConstantUnion(stride, loc, true), loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpInterlockedAdd:
    case EOpInterlockedAnd:
    case EOpInterlockedExchange:
    case EOpInterlockedMax:
    case EOpInterlockedMin:
    case EOpInterlockedOr:
    case EOpInterlockedXor:
    case EOpInterlockedCompareExchange:
    case EOpInterlockedCompareStore:
        {
            // We'll replace the first argument with the block dereference, and let
            // downstream decomposition handle the rest.

            TIntermSequence& sequence = argAggregate->getSequence();

            TIntermTyped* argIndex     = makeIntegerIndex(sequence[1]->getAsTyped());  // index
            argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex, intermediate.addConstantUnion(2, loc, true),
                                                  loc, TType(EbtInt));

            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;
            TIntermTyped* element = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            element->setType(derefType);

            // Replace the numeric byte offset parameter with array reference.
            sequence[1] = element;
            sequence.erase(sequence.begin(), sequence.begin()+1);
        }
        break;

    case EOpMethodIncrementCounter:
        {
            node = incDecCounter(1);
            break;
        }

    case EOpMethodDecrementCounter:
        {
            TIntermTyped* preIncValue = incDecCounter(-1); // result is original value
            node = intermediate.addBinaryNode(EOpAdd, preIncValue, intermediate.addConstantUnion(-1, loc, true), loc,
                                              preIncValue->getType());
            break;
        }

    case EOpMethodAppend:
        {
            TIntermTyped* oldCounter = incDecCounter(1);

            TIntermTyped* lValue = intermediate.addIndex(EOpIndexIndirect, argArray, oldCounter, loc);
            TIntermTyped* rValue = argAggregate->getSequence()[1]->getAsTyped();

            const TType derefType(argArray->getType(), 0);
            lValue->setType(derefType);

            node = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

            break;
        }

    case EOpMethodConsume:
        {
            TIntermTyped* oldCounter = incDecCounter(-1);

            TIntermTyped* newCounter = intermediate.addBinaryNode(EOpAdd, oldCounter,
                                                                  intermediate.addConstantUnion(-1, loc, true), loc,
                                                                  oldCounter->getType());

            node = intermediate.addIndex(EOpIndexIndirect, argArray, newCounter, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);

            break;
        }

    default:
        break; // most pass through unchanged
    }
}